

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

char * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
          ValueLength *length)

{
  byte bVar1;
  uint8_t *puVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  Exception *in_RSI;
  char *in_RDI;
  uint8_t h;
  undefined4 in_stack_ffffffffffffffdc;
  ExceptionType type;
  uint8_t *local_10;
  
  bVar1 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f64d);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffdc);
  if ((bVar1 < 0x40) || (0xbe < bVar1)) {
    if (bVar1 != 0xbf) {
      uVar4 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_RSI,type,in_RDI);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    puVar2 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f6a8);
    uVar3 = readIntegerFixed<unsigned_long,8ul>(puVar2 + 1);
    *(unsigned_long *)in_RSI = uVar3;
    local_10 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f6d6
                    );
    local_10 = local_10 + 9;
  }
  else {
    *(long *)in_RSI = (long)(int)(bVar1 - 0x40);
    local_10 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f684
                    );
    local_10 = local_10 + 1;
  }
  return (char *)local_10;
}

Assistant:

char const* getString(ValueLength& length) const {
    uint8_t const h = head();
    if (h >= 0x40 && h <= 0xbe) {
      // short UTF-8 String
      length = h - 0x40;
      return reinterpret_cast<char const*>(start() + 1);
    }

    if (h == 0xbf) {
      // long UTF-8 String
      length = readIntegerFixed<ValueLength, 8>(start() + 1);
      checkOverflow(length);
      return reinterpret_cast<char const*>(start() + 1 + 8);
    }

    throw Exception(Exception::InvalidValueType, "Expecting type String");
  }